

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-capnp.c++
# Opt level: O2

StringTree * __thiscall
capnp::anon_unknown_1::CapnpcCapnpMain::genParamList
          (StringTree *__return_storage_ptr__,CapnpcCapnpMain *this,InterfaceSchema interface,
          StructSchema schema,Reader brand,Method method)

{
  Reader type;
  Reader value;
  Reader value_00;
  Reader list;
  bool bVar1;
  anon_union_8_2_eba6ea51_for_Type_5 params_1;
  char (*params) [1];
  CapnpcCapnpMain *this_00;
  StringTree *in_R8;
  Type TVar2;
  Type type_00;
  StringPtr delim;
  StringTree *params_4;
  StructSchema schema_local;
  ArrayBuilder<kj::StringTree> builder;
  IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field> local_468;
  ArrayPtr<const_char> local_458;
  Reader slot;
  Array<kj::StringTree> local_410;
  Reader proto;
  Field local_3c8;
  Reader local_388;
  Reader local_358;
  CapnpcCapnpMain local_328;
  Reader local_2f8;
  Field local_2c8;
  StringTree local_288;
  StringTree local_250;
  StringTree local_218;
  Reader local_1e0;
  FieldList local_198;
  StringTree local_158;
  StringTree local_120;
  StringTree local_e8;
  FieldList local_b0;
  Maybe<capnp::InterfaceSchema::Method> local_78;
  
  schema_local = schema;
  Schema::getProto(&local_1e0,&schema_local.super_Schema);
  if ((local_1e0._reader.dataSize < 0xc0) || (*(long *)((long)local_1e0._reader.data + 0x10) == 0))
  {
    StructSchema::getFields(&local_b0,&schema_local);
    local_198.list.reader.nestingLimit = local_b0.list.reader.nestingLimit;
    local_198.list.reader._44_4_ = local_b0.list.reader._44_4_;
    local_198.list.reader.elementCount = local_b0.list.reader.elementCount;
    local_198.list.reader.step = local_b0.list.reader.step;
    local_198.list.reader.structDataSize = local_b0.list.reader.structDataSize;
    local_198.list.reader.structPointerCount = local_b0.list.reader.structPointerCount;
    local_198.list.reader.elementSize = local_b0.list.reader.elementSize;
    local_198.list.reader._39_1_ = local_b0.list.reader._39_1_;
    local_198.list.reader.capTable = local_b0.list.reader.capTable;
    local_198.list.reader.ptr = local_b0.list.reader.ptr;
    local_198.parent.super_Schema.raw = local_b0.parent.super_Schema.raw;
    local_198.list.reader.segment = local_b0.list.reader.segment;
    builder.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<kj::StringTree>
                            (local_b0.list.reader._24_8_ & 0xffffffff);
    builder.endPtr = builder.ptr + (local_b0.list.reader._24_8_ & 0xffffffff);
    builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    builder.pos = builder.ptr;
    local_468.container = &local_198;
    for (local_468.index = 0; local_468.index != local_198.list.reader.elementCount;
        local_468.index = local_468.index + 1) {
      _::IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>::
      operator*(&local_3c8,&local_468);
      local_2c8.parent.super_Schema.raw = local_3c8.parent.super_Schema.raw;
      local_2c8.index = local_3c8.index;
      local_2c8._12_4_ = local_3c8._12_4_;
      local_2c8.proto._reader.segment = local_3c8.proto._reader.segment;
      local_2c8.proto._reader.capTable = local_3c8.proto._reader.capTable;
      local_2c8.proto._reader.data = local_3c8.proto._reader.data;
      local_2c8.proto._reader.pointers = local_3c8.proto._reader.pointers;
      local_2c8.proto._reader.dataSize = local_3c8.proto._reader.dataSize;
      local_2c8.proto._reader.pointerCount = local_3c8.proto._reader.pointerCount;
      local_2c8.proto._reader._38_2_ = local_3c8.proto._reader._38_2_;
      local_2c8.proto._reader.nestingLimit = local_3c8.proto._reader.nestingLimit;
      local_2c8.proto._reader._44_4_ = local_3c8.proto._reader._44_4_;
      proto._reader.dataSize = local_3c8.proto._reader.dataSize;
      proto._reader.pointerCount = local_3c8.proto._reader.pointerCount;
      proto._reader._38_2_ = local_3c8.proto._reader._38_2_;
      proto._reader.nestingLimit = local_3c8.proto._reader.nestingLimit;
      proto._reader._44_4_ = local_3c8.proto._reader._44_4_;
      proto._reader.data = local_3c8.proto._reader.data;
      proto._reader.pointers = local_3c8.proto._reader.pointers;
      proto._reader.segment = local_3c8.proto._reader.segment;
      proto._reader.capTable = local_3c8.proto._reader.capTable;
      slot._reader.dataSize = local_3c8.proto._reader.dataSize;
      slot._reader.pointerCount = local_3c8.proto._reader.pointerCount;
      slot._reader._38_2_ = local_3c8.proto._reader._38_2_;
      slot._reader.nestingLimit = local_3c8.proto._reader.nestingLimit;
      slot._reader._44_4_ = local_3c8.proto._reader._44_4_;
      slot._reader.data = local_3c8.proto._reader.data;
      slot._reader.pointers = local_3c8.proto._reader.pointers;
      slot._reader.segment = local_3c8.proto._reader.segment;
      slot._reader.capTable = local_3c8.proto._reader.capTable;
      local_458 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName(&proto);
      capnp::schema::Field::Slot::Reader::getType(&local_2f8,&slot);
      local_1e0._reader.segment._0_1_ = 0;
      params_1.schema = (RawBrandedSchema *)&local_1e0;
      type._reader.capTable = local_2f8._reader.capTable;
      type._reader.segment = local_2f8._reader.segment;
      type._reader.data = local_2f8._reader.data;
      type._reader.pointers = local_2f8._reader.pointers;
      type._reader.dataSize = local_2f8._reader.dataSize;
      type._reader.pointerCount = local_2f8._reader.pointerCount;
      type._reader._38_2_ = local_2f8._reader._38_2_;
      type._reader.nestingLimit = local_2f8._reader.nestingLimit;
      type._reader._44_4_ = local_2f8._reader._44_4_;
      genType(&local_218,this,type,interface.super_Schema.raw,
              (Maybe<capnp::InterfaceSchema::Method> *)params_1.schema);
      this_00 = &local_328;
      capnp::schema::Field::Slot::Reader::getDefaultValue((Reader *)this_00,&slot);
      value._reader.capTable = (CapTableReader *)local_328.schemaLoader.impl.mutex._0_8_;
      value._reader.segment = (SegmentReader *)local_328.context;
      value._reader.data = local_328.schemaLoader.impl.mutex.waitersHead.ptr;
      value._reader.pointers = (WirePointer *)local_328.schemaLoader.impl.mutex.waitersTail;
      value._reader._32_8_ = local_328.schemaLoader.impl.value.disposer;
      value._reader._40_8_ = local_328.schemaLoader.impl.value.ptr;
      bVar1 = isEmptyValue(this_00,value);
      if (bVar1) {
        kj::strTree<char_const(&)[1]>(&local_e8,(kj *)0x1ae02f,params);
      }
      else {
        TVar2 = StructSchema::Field::getType(&local_2c8);
        type_00._0_8_ = TVar2.field_4;
        capnp::schema::Field::Slot::Reader::getDefaultValue(&local_358,&slot);
        value_00._reader.capTable = local_358._reader.capTable;
        value_00._reader.segment = local_358._reader.segment;
        value_00._reader.data = local_358._reader.data;
        value_00._reader.pointers = local_358._reader.pointers;
        value_00._reader.dataSize = local_358._reader.dataSize;
        value_00._reader.pointerCount = local_358._reader.pointerCount;
        value_00._reader._38_2_ = local_358._reader._38_2_;
        value_00._reader.nestingLimit = local_358._reader.nestingLimit;
        value_00._reader._44_4_ = local_358._reader._44_4_;
        type_00.field_4.schema = params_1.schema;
        genValue(&local_250,TVar2._0_8_,type_00,value_00);
        kj::strTree<char_const(&)[4],kj::StringTree>
                  (&local_e8,(kj *)0x19d932,(char (*) [4])&local_250,(StringTree *)params_1.schema);
      }
      capnp::schema::Field::Reader::getAnnotations(&local_388,&proto);
      list.reader.capTable = local_388.reader.capTable;
      list.reader.segment = local_388.reader.segment;
      list.reader.ptr = local_388.reader.ptr;
      list.reader.elementCount = local_388.reader.elementCount;
      list.reader.step = local_388.reader.step;
      list.reader.structDataSize = local_388.reader.structDataSize;
      list.reader.structPointerCount = local_388.reader.structPointerCount;
      list.reader.elementSize = local_388.reader.elementSize;
      list.reader._39_1_ = local_388.reader._39_1_;
      list.reader.nestingLimit = local_388.reader.nestingLimit;
      list.reader._44_4_ = local_388.reader._44_4_;
      params_4 = (StringTree *)local_388.reader.segment;
      genAnnotations(&local_120,this,list,interface.super_Schema.raw);
      in_R8 = &local_e8;
      kj::strTree<capnp::Text::Reader,char_const(&)[3],kj::StringTree,kj::StringTree,kj::StringTree>
                (&local_158,(kj *)&local_458,(Reader *)0x19d8b2,(char (*) [3])&local_218,&local_e8,
                 &local_120,params_4);
      kj::StringTree::~StringTree(&local_120);
      kj::StringTree::~StringTree(&local_e8);
      if (!bVar1) {
        kj::StringTree::~StringTree(&local_250);
      }
      kj::StringTree::~StringTree(&local_218);
      kj::StringTree::StringTree(builder.pos,&local_158);
      builder.pos = builder.pos + 1;
      kj::StringTree::~StringTree(&local_158);
    }
    local_410.size_ = ((long)builder.pos - (long)builder.ptr) / 0x38;
    local_410.ptr = builder.ptr;
    local_410.disposer = builder.disposer;
    builder.ptr = (StringTree *)0x0;
    builder.pos = (RemoveConst<kj::StringTree> *)0x0;
    builder.endPtr = (StringTree *)0x0;
    kj::ArrayBuilder<kj::StringTree>::dispose(&builder);
    delim.content.size_ = 3;
    delim.content.ptr = ", ";
    kj::StringTree::StringTree(&local_288,&local_410,delim);
    kj::strTree<char_const(&)[2],kj::StringTree,char_const(&)[2]>
              (__return_storage_ptr__,(kj *)0x19d8af,(char (*) [2])&local_288,(StringTree *)0x1a9b4b
               ,(char (*) [2])in_R8);
    kj::StringTree::~StringTree(&local_288);
    kj::Array<kj::StringTree>::~Array(&local_410);
  }
  else {
    local_78.ptr.isSet = true;
    local_78.ptr.field_1.value.parent.super_Schema.raw =
         (InterfaceSchema)(InterfaceSchema)method.parent.super_Schema.raw;
    local_78.ptr.field_1._8_8_ = method._8_8_;
    local_78.ptr.field_1.value.proto._reader.segment = method.proto._reader.segment;
    local_78.ptr.field_1.value.proto._reader.capTable = method.proto._reader.capTable;
    local_78.ptr.field_1.value.proto._reader.data = method.proto._reader.data;
    local_78.ptr.field_1.value.proto._reader.pointers = method.proto._reader.pointers;
    local_78.ptr.field_1.value.proto._reader.dataSize = method.proto._reader.dataSize;
    local_78.ptr.field_1.value.proto._reader.pointerCount = method.proto._reader.pointerCount;
    local_78.ptr.field_1._54_2_ = method.proto._reader._38_2_;
    local_78.ptr.field_1._56_8_ = method.proto._reader._40_8_;
    nodeName(__return_storage_ptr__,this,schema_local.super_Schema.raw,interface.super_Schema.raw,
             brand,&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::StringTree genParamList(InterfaceSchema interface, StructSchema schema,
                              schema::Brand::Reader brand, InterfaceSchema::Method method) {
    if (schema.getProto().getScopeId() == 0) {
      // A named parameter list.
      return kj::strTree("(", kj::StringTree(
          KJ_MAP(field, schema.getFields()) {
            auto proto = field.getProto();
            auto slot = proto.getSlot();

            return kj::strTree(
                proto.getName(), " :", genType(slot.getType(), interface, nullptr),
                isEmptyValue(slot.getDefaultValue()) ? kj::strTree("") :
                    kj::strTree(" = ", genValue(field.getType(), slot.getDefaultValue())),
                genAnnotations(proto.getAnnotations(), interface));
          }, ", "), ")");
    } else {
      return nodeName(schema, interface, brand, method);
    }
  }